

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void __thiscall AllocatorState::AllocatorState(AllocatorState *this,int seed)

{
  int iVar1;
  double delta;
  int seed_local;
  AllocatorState *this_local;
  
  TestHarness::TestHarness(&this->super_TestHarness,seed);
  this->_vptr_AllocatorState = (_func_int **)&PTR__AllocatorState_001bea80;
  this->memalign_fraction_ = 0.0;
  if ((kOSSupportsMemalign & 1U) != 0) {
    iVar1 = TestHarness::Uniform(&this->super_TestHarness,10000);
    this->memalign_fraction_ = ((double)iVar1 / 10000.0) * 0.4 + 0.0;
  }
  return;
}

Assistant:

explicit AllocatorState(int seed) : TestHarness(seed), memalign_fraction_(0) {
    if (kOSSupportsMemalign) {
      CHECK_GE(FLAGS_memalign_max_fraction, 0);
      CHECK_LE(FLAGS_memalign_max_fraction, 1);
      CHECK_GE(FLAGS_memalign_min_fraction, 0);
      CHECK_LE(FLAGS_memalign_min_fraction, 1);
      double delta = FLAGS_memalign_max_fraction - FLAGS_memalign_min_fraction;
      CHECK_GE(delta, 0);
      memalign_fraction_ = (Uniform(10000)/10000.0 * delta +
                            FLAGS_memalign_min_fraction);
      //printf("memalign fraction: %f\n", memalign_fraction_);
    }
  }